

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O0

int read_token(char *buffer,char *token,size_t len)

{
  ushort **ppuVar1;
  char *local_30;
  char *pi;
  char *po;
  size_t len_local;
  char *token_local;
  char *buffer_local;
  
  local_30 = buffer;
  pi = token;
  if (*buffer == '{') {
    local_30 = buffer + 1;
  }
  do {
    if (*local_30 == '\0' || token + len <= pi) {
LAB_0010939e:
      *pi = '\0';
      return (int)local_30 - (int)buffer;
    }
    if (*local_30 == '}') {
      local_30 = local_30 + 1;
      goto LAB_0010939e;
    }
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*local_30] & 8) == 0) goto LAB_0010939e;
    *pi = *local_30;
    local_30 = local_30 + 1;
    pi = pi + 1;
  } while( true );
}

Assistant:

static int read_token(const char *buffer, char *token, size_t len)
{
    char *po = token;
    const char *pi = buffer;
    if (*pi == '{') ++pi;
    while (*pi && po < token + len) {
        if (*pi == '}') {
            ++pi;
            break;
        }
        if (!isalnum(*pi)) {
            break;
        }
        *po++ = *pi++;
    }
    *po = '\0';
    return (int)(pi - buffer);
}